

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall
Rml::Element::SetOffset(Element *this,Vector2f offset,Element *_offset_parent,bool _offset_fixed)

{
  Vector2<float> rhs;
  Vector2<float> rhs_00;
  Position PVar1;
  bool bVar2;
  bool bVar3;
  Vector2f local_40;
  Vector2f old_position;
  Vector2f old_base;
  bool _offset_fixed_local;
  Element *_offset_parent_local;
  Element *this_local;
  Vector2f offset_local;
  
  PVar1 = GetPosition(this);
  bVar2 = _offset_fixed || PVar1 == Fixed;
  bVar3 = Vector2<float>::operator!=(&this->relative_offset_base,offset);
  if (((bVar3) || (this->offset_parent != _offset_parent)) ||
     ((bool)(this->offset_fixed & 1U) != bVar2)) {
    this->relative_offset_base = offset;
    this->offset_fixed = bVar2;
    this->offset_parent = _offset_parent;
    UpdateOffset(this);
    DirtyAbsoluteOffset(this);
  }
  else {
    old_position = this->relative_offset_base;
    local_40 = this->relative_offset_position;
    UpdateOffset(this);
    rhs.x = (this->relative_offset_base).x;
    rhs.y = (this->relative_offset_base).y;
    bVar2 = Vector2<float>::operator!=(&old_position,rhs);
    if ((bVar2) ||
       (rhs_00.x = (this->relative_offset_position).x, rhs_00.y = (this->relative_offset_position).y
       , bVar2 = Vector2<float>::operator!=(&local_40,rhs_00), bVar2)) {
      DirtyAbsoluteOffset(this);
    }
  }
  return;
}

Assistant:

void Element::SetOffset(Vector2f offset, Element* _offset_parent, bool _offset_fixed)
{
	_offset_fixed |= GetPosition() == Style::Position::Fixed;

	// If our offset has definitely changed, or any of our parenting has, then these are set and
	// updated based on our left / right / top / bottom properties.
	if (relative_offset_base != offset || offset_parent != _offset_parent || offset_fixed != _offset_fixed)
	{
		relative_offset_base = offset;
		offset_fixed = _offset_fixed;
		offset_parent = _offset_parent;
		UpdateOffset();
		DirtyAbsoluteOffset();
	}

	// Otherwise, our offset is updated in case left / right / top / bottom will have an impact on
	// our final position, and our children are dirtied if they do.
	else
	{
		const Vector2f old_base = relative_offset_base;
		const Vector2f old_position = relative_offset_position;

		UpdateOffset();

		if (old_base != relative_offset_base || old_position != relative_offset_position)
			DirtyAbsoluteOffset();
	}
}